

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

Block * duckdb_moodycamel::
        ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
        ::
        create<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (void)

{
  Block *pBVar1;
  
  pBVar1 = (Block *)malloc(0x248);
  if (pBVar1 != (Block *)0x0) {
    (pBVar1->freeListRefs).super___atomic_base<unsigned_int>._M_i = 0;
    (pBVar1->freeListNext)._M_b._M_p = (__pointer_type)0x0;
    pBVar1->shouldBeOnFreeList = (__atomic_base<bool>)0x0;
    pBVar1->dynamicallyAllocated = true;
    pBVar1->next = (Block *)0x0;
    (pBVar1->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
  }
  return pBVar1;
}

Assistant:

static inline U* create()
	{
		void* p = aligned_malloc<U>(sizeof(U));
		return p != nullptr ? new (p) U : nullptr;
	}